

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rattle.cpp
# Opt level: O0

int __thiscall OpenMD::Rattle::constraintPairB(Rattle *this,ConstraintPair *consPair)

{
  bool bVar1;
  bool bVar2;
  Vector<double,_3U> *v1;
  ConstraintPair *in_RSI;
  Vector<double,_3U> *in_RDI;
  RealType RVar3;
  RealType RVar4;
  double dVar5;
  ConstraintElem *this_00;
  double dVar6;
  RealType proj;
  Vector3d fcons;
  Vector3d delta;
  RealType gab;
  RealType rvab;
  RealType rmb;
  RealType rma;
  Vector3d rab;
  Vector3d posB;
  Vector3d posA;
  Vector3d dv;
  Vector3d velB;
  Vector3d velA;
  ConstraintElem *consElem2;
  ConstraintElem *consElem1;
  ConstraintElem *in_stack_fffffffffffffe28;
  Vector<double,_3U> *in_stack_fffffffffffffe30;
  Vector<double,_3U> *in_stack_fffffffffffffe40;
  Vector3d *in_stack_fffffffffffffea8;
  Snapshot *in_stack_fffffffffffffeb0;
  uint local_4;
  
  ConstraintPair::getConsElem1(in_RSI);
  ConstraintPair::getConsElem2(in_RSI);
  ConstraintElem::getVel(in_stack_fffffffffffffe28);
  ConstraintElem::getVel(in_stack_fffffffffffffe28);
  OpenMD::operator-(in_RDI,in_stack_fffffffffffffe30);
  Vector3<double>::Vector3
            ((Vector3<double> *)in_stack_fffffffffffffe30,
             (Vector<double,_3U> *)in_stack_fffffffffffffe28);
  ConstraintElem::getPos(in_stack_fffffffffffffe28);
  ConstraintElem::getPos(in_stack_fffffffffffffe28);
  OpenMD::operator-(in_RDI,in_stack_fffffffffffffe30);
  Vector3<double>::Vector3
            ((Vector3<double> *)in_stack_fffffffffffffe30,
             (Vector<double,_3U> *)in_stack_fffffffffffffe28);
  Snapshot::wrapVector(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  RVar3 = ConstraintElem::getMass((ConstraintElem *)0x3c5289);
  RVar4 = ConstraintElem::getMass((ConstraintElem *)0x3c52ae);
  dVar5 = dot<double,3u>(in_stack_fffffffffffffe40,in_RDI);
  v1 = (Vector<double,_3U> *)((ulong)dVar5 ^ 0x8000000000000000);
  this_00 = (ConstraintElem *)(1.0 / RVar3 + 1.0 / RVar4);
  RVar3 = ConstraintPair::getConsDistSquare(in_RSI);
  dVar5 = ABS((double)v1 / ((double)this_00 * RVar3));
  bVar1 = dVar5 == in_RDI->data_[2];
  bVar2 = dVar5 < in_RDI->data_[2];
  if (!bVar2 && !bVar1) {
    OpenMD::operator*(in_RDI,(double)this_00);
    Vector3<double>::Vector3
              ((Vector3<double> *)this_00,(Vector<double,_3U> *)in_stack_fffffffffffffe28);
    OpenMD::operator*((double)in_RDI,(Vector<double,_3U> *)this_00);
    Vector<double,_3U>::operator+=
              ((Vector<double,_3U> *)this_00,(Vector<double,_3U> *)in_stack_fffffffffffffe28);
    ConstraintElem::setVel(this_00,(Vector3d *)in_stack_fffffffffffffe28);
    OpenMD::operator*((double)in_RDI,(Vector<double,_3U> *)this_00);
    Vector<double,_3U>::operator-=
              ((Vector<double,_3U> *)this_00,(Vector<double,_3U> *)in_stack_fffffffffffffe28);
    ConstraintElem::setVel(this_00,(Vector3d *)in_stack_fffffffffffffe28);
    OpenMD::operator*((double)in_RDI,(Vector<double,_3U> *)this_00);
    operator/(in_RDI,(double)this_00);
    Vector3<double>::Vector3
              ((Vector3<double> *)this_00,(Vector<double,_3U> *)in_stack_fffffffffffffe28);
    dVar5 = Vector<double,_3U>::length((Vector<double,_3U> *)0x3c547c);
    dVar6 = dot<double,3u>(v1,in_RDI);
    ConstraintPair::addConstraintForce
              (in_RSI,(RealType)((ulong)ABS(dVar5) | (ulong)dVar6 & 0x8000000000000000));
  }
  local_4 = (uint)(bVar2 || bVar1);
  return local_4;
}

Assistant:

int Rattle::constraintPairB(ConstraintPair* consPair) {
    ConstraintElem* consElem1 = consPair->getConsElem1();
    ConstraintElem* consElem2 = consPair->getConsElem2();

    Vector3d velA = consElem1->getVel();
    Vector3d velB = consElem2->getVel();

    Vector3d dv = velA - velB;

    Vector3d posA = consElem1->getPos();
    Vector3d posB = consElem2->getPos();

    Vector3d rab = posA - posB;

    currentSnapshot_->wrapVector(rab);

    RealType rma = 1.0 / consElem1->getMass();
    RealType rmb = 1.0 / consElem2->getMass();

    RealType rvab = dot(rab, dv);

    RealType gab = -rvab / ((rma + rmb) * consPair->getConsDistSquare());

    if (fabs(gab) > consTolerance_) {
      Vector3d delta = rab * gab;
      velA += rma * delta;
      consElem1->setVel(velA);

      velB -= rmb * delta;
      consElem2->setVel(velB);

      // report the constraint force back to the constraint pair:

      Vector3d fcons = 2.0 * delta / dt_;
      RealType proj  = copysign(fcons.length(), dot(fcons, rab));

      consPair->addConstraintForce(proj);
      return consSuccess;
    } else {
      return consAlready;
    }
  }